

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::TraceConfig_CmdTraceStartDelay::ParseFromArray
          (TraceConfig_CmdTraceStartDelay *this,void *raw,size_t size)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ushort uVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dst;
  bool bVar6;
  uint uVar7;
  ulong *puVar8;
  ulong uVar9;
  ulong *puVar10;
  ulong *puVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint *puVar15;
  ulong *puVar16;
  bool bVar17;
  ulong local_58;
  Field local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  ulong *local_38;
  
  dst = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar16 = (ulong *)(size + (long)raw);
  do {
    lVar5 = 7;
    if (puVar16 <= raw) goto LAB_002477fe;
    uVar9 = (ulong)(char)(byte)*raw;
    puVar8 = (ulong *)((long)raw + 1);
    if ((long)uVar9 < 0) {
      bVar1 = (byte)*raw;
      uVar2 = (ulong)(bVar1 & 0x7f);
      bVar6 = false;
      puVar10 = puVar8;
      for (; (uVar9 = uVar2, puVar11 = puVar10, (char)bVar1 < '\0' &&
             (bVar17 = 0x38 < lVar5 - 7U, bVar6 = bVar17 || puVar16 <= puVar10,
             size = (size_t)puVar10, uVar9 = 0, puVar11 = puVar8, !bVar17 && puVar16 > puVar10));
          lVar5 = lVar5 + 7) {
        bVar1 = (byte)*puVar10;
        puVar10 = (ulong *)((long)puVar10 + 1);
        uVar2 = uVar2 | (ulong)(bVar1 & 0x7f) << ((byte)lVar5 & 0x3f);
        size = (size_t)puVar10;
      }
      puVar8 = puVar11;
      if (bVar6) {
        puVar8 = (ulong *)raw;
        uVar9 = 0;
      }
      if (puVar8 == (ulong *)raw) goto LAB_002477fe;
    }
    uVar7 = (uint)(uVar9 >> 3);
    if ((uVar7 == 0) || (puVar16 <= puVar8)) {
switchD_00247664_caseD_3:
      bVar6 = false;
      uVar9 = 0;
      local_50.int_value_ = 0;
    }
    else {
      switch((uint)uVar9 & 7) {
      case 0:
        uVar12 = 0;
        bVar6 = puVar8 >= puVar16;
        if (puVar8 < puVar16) {
          size = (long)puVar8 + 1;
          uVar2 = (ulong)((byte)*puVar8 & 0x7f);
          uVar3 = uVar2;
          uVar14 = 0;
          if ((char)(byte)*puVar8 < '\0') {
            uVar3 = 0;
            uVar14 = 0;
            lVar5 = 7;
            puVar10 = (ulong *)size;
            do {
              bVar17 = 0x38 < lVar5 - 7U;
              bVar6 = bVar17 || puVar16 <= puVar10;
              if (bVar17 || puVar16 <= puVar10) goto LAB_00247805;
              uVar13 = *puVar10;
              puVar10 = (ulong *)((long)puVar10 + 1);
              uVar2 = uVar2 | (ulong)((byte)uVar13 & 0x7f) << ((byte)lVar5 & 0x3f);
              lVar5 = lVar5 + 7;
            } while ((char)(byte)uVar13 < '\0');
            uVar3 = uVar2 & 0xffffffff;
            size = (size_t)puVar10;
            uVar14 = (uint)(uVar2 >> 0x20);
          }
        }
        else {
          uVar3 = 0;
          uVar14 = 0;
        }
LAB_00247805:
        uVar2 = (ulong)uVar14;
        if (bVar6) {
          size = (size_t)puVar8;
          uVar2 = uVar12;
          uVar3 = uVar12;
        }
        local_38 = (ulong *)raw;
        if ((ulong *)size != puVar8) goto LAB_00247831;
        uVar9 = 0;
        bVar6 = false;
        local_50.int_value_ = uVar12;
        goto LAB_00247873;
      case 1:
        size = (size_t)(puVar8 + 1);
        if (puVar16 < size) {
LAB_002477fe:
          uVar9 = 0;
          bVar6 = false;
          local_50.int_value_ = 0;
          goto LAB_00247873;
        }
        uVar3 = *puVar8;
        uVar2 = uVar3 >> 0x20;
        break;
      case 2:
        bVar6 = puVar8 >= puVar16;
        uVar3 = local_58;
        if (puVar8 < puVar16) {
          puVar10 = (ulong *)((long)puVar8 + 1);
          uVar2 = (ulong)((byte)*puVar8 & 0x7f);
          size = (size_t)puVar10;
          uVar3 = uVar2;
          if ((char)(byte)*puVar8 < '\0') {
            lVar5 = 7;
            puVar11 = puVar10;
            do {
              bVar6 = 0x38 < lVar5 - 7U || puVar16 <= puVar11;
              size = (size_t)puVar10;
              uVar3 = local_58;
              if (bVar6) break;
              uVar12 = *puVar11;
              size = (long)puVar11 + 1;
              uVar2 = uVar2 | (ulong)((byte)uVar12 & 0x7f) << ((byte)lVar5 & 0x3f);
              lVar5 = lVar5 + 7;
              puVar11 = (ulong *)size;
              uVar3 = uVar2;
            } while ((char)(byte)uVar12 < '\0');
          }
        }
        uVar2 = 0;
        local_58 = uVar3;
        if (bVar6) {
          size = (size_t)puVar8;
          local_58 = uVar2;
        }
        if ((ulong *)size == puVar8) {
          uVar3 = 0;
          bVar6 = false;
          uVar12 = 0;
        }
        else if ((long)puVar16 - size < local_58) {
          uVar2 = 0;
          uVar3 = 0;
          bVar6 = false;
          uVar12 = 0;
        }
        else {
          uVar2 = size >> 0x20;
          uVar3 = size & 0xffffffff;
          size = size + local_58;
          bVar6 = true;
          uVar12 = local_58;
        }
        if (!bVar6) goto LAB_002477fe;
        goto LAB_00247831;
      default:
        goto switchD_00247664_caseD_3;
      case 5:
        size = (long)puVar8 + 4;
        uVar2 = 0;
        if (puVar16 < size) goto LAB_002477fe;
        uVar3 = (ulong)(uint)*puVar8;
      }
      uVar12 = 0;
LAB_00247831:
      bVar6 = true;
      raw = (void *)size;
      if ((uVar7 < 0x10000) && (uVar12 < 0x10000000)) {
        local_50.int_value_ = uVar3 & 0xffffffff | uVar2 << 0x20;
        uVar9 = uVar12 | (uVar9 >> 3) << 0x20 | (ulong)((uint)uVar9 & 7) << 0x30;
        bVar6 = false;
      }
      else {
        local_50.int_value_ = 0;
        uVar9 = 0;
      }
    }
LAB_00247873:
    puVar15 = &switchD_00247664::switchdataD_0034e080;
    if (!bVar6) {
      local_50.size_ = (uint32_t)uVar9;
      local_50.type_ = (uint8_t)(uVar9 >> 0x30);
      local_50.id_ = (uint16_t)(uVar9 >> 0x20);
      local_40 = dst;
      uVar2 = local_50.int_value_;
      do {
        if (local_50.id_ == 0) {
          return puVar16 == (ulong *)raw;
        }
        uVar4 = (ushort)(uVar9 >> 0x20);
        if (uVar4 < 3) {
          (this->_has_field_).super__Base_bitset<1UL>._M_w =
               (this->_has_field_).super__Base_bitset<1UL>._M_w |
               1L << ((byte)(uVar9 >> 0x20) & 0x3f);
        }
        if (uVar4 == 2) {
          this->max_delay_ms_ = (uint32_t)local_50.int_value_;
        }
        else if (((uint)(uVar9 >> 0x20) & 0xffff) == 1) {
          this->min_delay_ms_ = (uint32_t)local_50.int_value_;
        }
        else {
          protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_50,dst);
        }
        do {
          if (puVar16 <= raw) goto LAB_00247a20;
          uVar9 = (ulong)(char)(byte)*raw;
          puVar8 = (ulong *)((long)raw + 1);
          if ((long)uVar9 < 0) {
            uVar3 = (ulong)((byte)*raw & 0x7f);
            bVar6 = false;
            uVar9 = uVar3;
            puVar10 = puVar8;
            if ((char)(byte)*raw < '\0') {
              lVar5 = 7;
              puVar11 = puVar8;
              do {
                bVar6 = 0x38 < lVar5 - 7U || puVar16 <= puVar11;
                uVar9 = 0;
                puVar10 = puVar8;
                if (bVar6) break;
                uVar12 = *puVar11;
                puVar10 = (ulong *)((long)puVar11 + 1);
                uVar3 = uVar3 | (ulong)((byte)uVar12 & 0x7f) << ((byte)lVar5 & 0x3f);
                lVar5 = lVar5 + 7;
                uVar9 = uVar3;
                puVar11 = puVar10;
              } while ((char)(byte)uVar12 < '\0');
            }
            puVar8 = puVar10;
            if (bVar6) {
              puVar8 = (ulong *)raw;
              uVar9 = 0;
            }
            if (puVar8 == (ulong *)raw) goto LAB_00247a20;
          }
          uVar7 = (uint)(uVar9 >> 3);
          if ((uVar7 == 0) || (puVar16 <= puVar8)) {
switchD_00247aa8_caseD_3:
            local_50.int_value_ = 0;
            bVar6 = false;
            uVar9 = 0;
            goto LAB_00247caa;
          }
          switch((uint)uVar9 & 7) {
          case 0:
            local_50.int_value_ = 0;
            bVar6 = puVar8 >= puVar16;
            if (puVar8 < puVar16) {
              puVar10 = (ulong *)((long)puVar8 + 1);
              uVar14 = (byte)*puVar8 & 0x7f;
              uVar3 = (ulong)uVar14;
              uVar12 = (ulong)uVar14;
              puVar15 = (uint *)puVar10;
              uVar14 = 0;
              if ((char)(byte)*puVar8 < '\0') {
                uVar12 = 0;
                lVar5 = 7;
                puVar11 = puVar10;
                do {
                  bVar17 = 0x38 < lVar5 - 7U;
                  bVar6 = bVar17 || puVar16 <= puVar11;
                  puVar15 = (uint *)puVar10;
                  uVar14 = 0;
                  if (bVar17 || puVar16 <= puVar11) break;
                  bVar1 = (byte)*puVar11;
                  puVar11 = (ulong *)((long)puVar11 + 1);
                  uVar3 = uVar3 | (ulong)(bVar1 & 0x7f) << ((byte)lVar5 & 0x3f);
                  lVar5 = lVar5 + 7;
                  if (-1 < (char)bVar1) {
                    uVar12 = uVar3 & 0xffffffff;
                  }
                  puVar15 = (uint *)puVar11;
                  uVar14 = (uint)(uVar3 >> 0x20);
                } while (-1 >= (char)bVar1);
              }
            }
            else {
              uVar12 = 0;
              uVar14 = 0;
            }
            if (bVar6) {
              uVar12 = local_50.int_value_;
            }
            uVar3 = (ulong)uVar14;
            if (bVar6) {
              puVar15 = (uint *)puVar8;
              uVar3 = local_50.int_value_;
            }
            dst = local_40;
            uVar13 = local_50.int_value_;
            local_38 = (ulong *)raw;
            if ((ulong *)puVar15 == puVar8) {
              uVar9 = 0;
              bVar6 = false;
            }
            else {
LAB_00247c5f:
              bVar6 = true;
              raw = puVar15;
              if ((uVar7 < 0x10000) && (uVar13 < 0x10000000)) {
                local_50.int_value_ = uVar12 & 0xffffffff | uVar3 << 0x20;
                uVar9 = uVar13 | (uVar9 >> 3) << 0x20 | (uVar9 & 7) << 0x30;
                bVar6 = false;
              }
              else {
                local_50.int_value_ = 0;
                uVar9 = 0;
              }
            }
            break;
          case 1:
            puVar15 = (uint *)(puVar8 + 1);
            if (puVar15 <= puVar16) {
              uVar12 = *puVar8;
              uVar3 = uVar12 >> 0x20;
LAB_00247b0d:
              uVar13 = 0;
              goto LAB_00247c5f;
            }
            goto LAB_00247a20;
          case 2:
            bVar6 = puVar8 >= puVar16;
            uVar3 = uVar2;
            if (puVar8 < puVar16) {
              puVar10 = (ulong *)((long)puVar8 + 1);
              uVar12 = (ulong)((byte)*puVar8 & 0x7f);
              puVar15 = (uint *)puVar10;
              uVar3 = uVar12;
              if ((char)(byte)*puVar8 < '\0') {
                lVar5 = 7;
                puVar11 = puVar10;
                do {
                  bVar6 = 0x38 < lVar5 - 7U || puVar16 <= puVar11;
                  puVar15 = (uint *)puVar10;
                  uVar3 = uVar2;
                  if (bVar6) break;
                  uVar13 = *puVar11;
                  puVar11 = (ulong *)((long)puVar11 + 1);
                  uVar12 = uVar12 | (ulong)((byte)uVar13 & 0x7f) << ((byte)lVar5 & 0x3f);
                  lVar5 = lVar5 + 7;
                  puVar15 = (uint *)puVar11;
                  uVar3 = uVar12;
                } while ((char)(byte)uVar13 < '\0');
              }
            }
            uVar2 = uVar3;
            if (bVar6) {
              puVar15 = (uint *)puVar8;
              uVar2 = 0;
            }
            if (((ulong *)puVar15 == puVar8) || ((ulong)((long)puVar16 - (long)puVar15) < uVar2)) {
              uVar12 = 0;
              uVar3 = 0;
              bVar6 = false;
              uVar13 = 0;
            }
            else {
              uVar3 = (ulong)puVar15 >> 0x20;
              uVar12 = (ulong)puVar15 & 0xffffffff;
              puVar15 = (uint *)((long)puVar15 + uVar2);
              bVar6 = true;
              uVar13 = uVar2;
            }
            if (bVar6) goto LAB_00247c5f;
            local_50.int_value_ = 0;
            uVar9 = 0;
            bVar6 = false;
            break;
          default:
            goto switchD_00247aa8_caseD_3;
          case 5:
            puVar15 = (uint *)((long)puVar8 + 4);
            uVar3 = 0;
            if (puVar15 <= puVar16) {
              uVar12 = (ulong)(uint)*puVar8;
              goto LAB_00247b0d;
            }
LAB_00247a20:
            local_50.int_value_ = 0;
            uVar9 = 0;
            bVar6 = false;
          }
LAB_00247caa:
        } while (bVar6);
        local_50.size_ = (uint32_t)uVar9;
        local_50.type_ = (uint8_t)(uVar9 >> 0x30);
        local_50.id_ = (uint16_t)(uVar9 >> 0x20);
      } while( true );
    }
  } while( true );
}

Assistant:

bool TraceConfig_CmdTraceStartDelay::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* min_delay_ms */:
        field.get(&min_delay_ms_);
        break;
      case 2 /* max_delay_ms */:
        field.get(&max_delay_ms_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}